

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void __thiscall cmInstallGenerator::GenerateScript(cmInstallGenerator *this,ostream *os)

{
  ostream *poVar1;
  string component_test;
  string sStack_38;
  
  CreateComponentTest(&sStack_38,(cmInstallGenerator *)os,&this->Component,this->ExcludeFromAll,
                      this->AllComponents);
  if (sStack_38._M_string_length != 0) {
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)0x0);
    poVar1 = std::operator<<(poVar1,"if(");
    poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
    std::operator<<(poVar1,")\n");
  }
  (*(this->super_cmScriptGenerator)._vptr_cmScriptGenerator[3])
            (this,os,(ulong)((this->AllComponents ^ 1) * 2));
  if (sStack_38._M_string_length != 0) {
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)0x0);
    std::operator<<(poVar1,"endif()\n\n");
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmInstallGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  std::string component_test = this->CreateComponentTest(
    this->Component, this->ExcludeFromAll, this->AllComponents);

  // Begin this block of installation.
  if (!component_test.empty()) {
    os << indent << "if(" << component_test << ")\n";
  }

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os,
                              this->AllComponents ? indent : indent.Next());

  // End this block of installation.
  if (!component_test.empty()) {
    os << indent << "endif()\n\n";
  }
}